

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c633::ktxTexture1WriteTestBase<unsigned_char,_4U,_32856U>::runTest
          (ktxTexture1WriteTestBase<unsigned_char,_4U,_32856U> *this,bool writeMetadata)

{
  bool bVar1;
  long lVar2;
  size_t sVar3;
  Message *pMVar4;
  AssertHelper *this_00;
  byte in_SIL;
  ktx_uint8_t *in_RDI;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  ktx_uint8_t *filePtr;
  ktx_size_t ktxMemFileLen;
  ktx_uint8_t *ktxMemFile;
  ktx_error_code_e result;
  ktxTexture1 *texture;
  char (*in_stack_fffffffffffffd28) [34];
  AssertionResult *in_stack_fffffffffffffd30;
  bool *in_stack_fffffffffffffd38;
  char *in_stack_fffffffffffffd40;
  char *in_stack_fffffffffffffd48;
  int line;
  char *in_stack_fffffffffffffd50;
  undefined8 in_stack_fffffffffffffd58;
  Type type;
  AssertHelper *in_stack_fffffffffffffd60;
  ktxTexture1 *in_stack_fffffffffffffd68;
  TextureWriterTestHelper<unsigned_char,_4U,_32856U> *in_stack_fffffffffffffd70;
  Message *in_stack_fffffffffffffd90;
  char *in_stack_fffffffffffffd98;
  TextureWriterTestHelper<unsigned_char,_4U,_32856U> *in_stack_fffffffffffffda8;
  AssertHelper *in_stack_fffffffffffffdb0;
  AssertionResult local_240 [2];
  undefined4 local_21c;
  ulong local_218;
  AssertionResult local_210 [2];
  undefined4 local_1f0;
  int local_1ec;
  AssertionResult local_1e8 [2];
  undefined1 local_1c2;
  undefined1 local_1c1;
  AssertionResult local_1c0 [2];
  undefined4 local_1a0;
  int local_19c;
  AssertionResult local_198;
  string local_188 [40];
  AssertHelper *local_160;
  undefined1 local_149;
  AssertionResult local_148 [2];
  undefined1 local_122;
  undefined1 local_121;
  AssertionResult local_120;
  string local_110 [55];
  undefined1 local_d9;
  AssertionResult local_d8;
  uint local_c4;
  string local_c0 [40];
  undefined8 local_98;
  undefined1 local_81;
  AssertionResult local_80 [3];
  undefined4 local_4c;
  AssertionResult local_48;
  KTX_header *local_38;
  undefined1 local_30 [8];
  KTX_header *local_28;
  ktx_error_code_e local_1c;
  long local_18;
  byte local_9;
  
  type = (Type)((ulong)in_stack_fffffffffffffd58 >> 0x20);
  local_9 = in_SIL & 1;
  local_18 = 0;
  local_1c = ktxTexture1_Create(in_RDI + 0x150,1,&local_18);
  local_4c = 0;
  testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
            (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
             (ktx_error_code_e *)in_stack_fffffffffffffd38,
             (ktx_error_code_e *)in_stack_fffffffffffffd30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_48);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd60);
    in_stack_fffffffffffffd98 =
         testing::AssertionResult::failure_message((AssertionResult *)0x14a2e2);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd60,type,in_stack_fffffffffffffd50,
               (int)((ulong)in_stack_fffffffffffffd48 >> 0x20),in_stack_fffffffffffffd40);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffdb0,(Message *)in_stack_fffffffffffffda8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd30);
    testing::Message::~Message((Message *)0x14a33f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14a3ad);
  local_81 = local_18 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffd30,(bool *)in_stack_fffffffffffffd28,(type *)0x14a3db);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_80);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd60);
    in_stack_fffffffffffffd90 =
         testing::Message::operator<<
                   ((Message *)in_stack_fffffffffffffd30,(char (*) [28])in_stack_fffffffffffffd28);
    local_98 = ktxErrorString(local_1c);
    testing::Message::operator<<
              ((Message *)in_stack_fffffffffffffd30,(char **)in_stack_fffffffffffffd28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffffda8,(char *)in_RDI,in_stack_fffffffffffffd98
               ,(char *)in_stack_fffffffffffffd90);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd60,type,in_stack_fffffffffffffd50,
               (int)((ulong)in_stack_fffffffffffffd48 >> 0x20),in_stack_fffffffffffffd40);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffdb0,(Message *)in_stack_fffffffffffffda8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd30);
    std::__cxx11::string::~string(local_c0);
    testing::Message::~Message((Message *)0x14a4ff);
  }
  local_c4 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14a5a9);
  if (local_c4 == 0) {
    if ((local_9 & 1) != 0) {
      lVar2 = local_18 + 0x50;
      sVar3 = strlen((char *)(in_RDI + 0x3c));
      ktxHashList_AddKVPair(lVar2,"KTXorientation",(int)sVar3 + 1,in_RDI + 0x3c);
    }
    local_1c = TextureWriterTestHelper<unsigned_char,_4U,_32856U>::copyImagesToTexture
                         (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    local_d9 = local_1c == KTX_SUCCESS;
    testing::AssertionResult::AssertionResult<bool>
              (in_stack_fffffffffffffd30,(bool *)in_stack_fffffffffffffd28,(type *)0x14a669);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffd60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)in_stack_fffffffffffffda8,(char *)in_RDI,
                 in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffd60,type,in_stack_fffffffffffffd50,
                 (int)((ulong)in_stack_fffffffffffffd48 >> 0x20),in_stack_fffffffffffffd40);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffdb0,(Message *)in_stack_fffffffffffffda8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd30);
      std::__cxx11::string::~string(local_110);
      testing::Message::~Message((Message *)0x14a72a);
    }
    local_c4 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x14a7d7);
    if (local_c4 == 0) {
      local_121 = TextureWriterTestHelper<unsigned_char,_4U,_32856U>::compareTexture1Images
                            (in_stack_fffffffffffffda8,in_RDI);
      local_122 = 1;
      testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                 &in_stack_fffffffffffffd30->success_);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_120);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffd60);
        testing::AssertionResult::failure_message((AssertionResult *)0x14a885);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffd60,type,in_stack_fffffffffffffd50,
                   (int)((ulong)in_stack_fffffffffffffd48 >> 0x20),in_stack_fffffffffffffd40);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffdb0,(Message *)in_stack_fffffffffffffda8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd30);
        testing::Message::~Message((Message *)0x14a8e2);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x14a950);
      local_1c = ktxTexture1_WriteToMemory(local_18,&local_28,local_30);
      local_149 = local_1c == 0;
      testing::AssertionResult::AssertionResult<bool>
                (in_stack_fffffffffffffd30,(bool *)in_stack_fffffffffffffd28,(type *)0x14a9a1);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_148);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffd60);
        testing::Message::operator<<((Message *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28)
        ;
        in_stack_fffffffffffffd60 = (AssertHelper *)ktxErrorString(local_1c);
        local_160 = in_stack_fffffffffffffd60;
        pMVar4 = testing::Message::operator<<
                           ((Message *)in_stack_fffffffffffffd30,(char **)in_stack_fffffffffffffd28)
        ;
        type = (Type)((ulong)pMVar4 >> 0x20);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((AssertionResult *)in_stack_fffffffffffffda8,(char *)in_RDI,
                   in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90);
        std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffd60,type,in_stack_fffffffffffffd50,
                   (int)((ulong)in_stack_fffffffffffffd48 >> 0x20),in_stack_fffffffffffffd40);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffdb0,(Message *)in_stack_fffffffffffffda8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd30);
        std::__cxx11::string::~string(local_188);
        testing::Message::~Message((Message *)0x14aac5);
      }
      local_c4 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x14ab72);
      if (local_c4 == 0) {
        local_19c = memcmp(local_28,(anonymous_namespace)::ktxId,0xc);
        local_1a0 = 0;
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
                   (int *)in_stack_fffffffffffffd38,(int *)in_stack_fffffffffffffd30);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_198);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffd60);
          in_stack_fffffffffffffd50 =
               testing::AssertionResult::failure_message((AssertionResult *)0x14ac20);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffd60,type,in_stack_fffffffffffffd50,
                     (int)((ulong)in_stack_fffffffffffffd48 >> 0x20),in_stack_fffffffffffffd40);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffdb0,(Message *)in_stack_fffffffffffffda8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd30);
          testing::Message::~Message((Message *)0x14ac7d);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x14aceb);
        local_1c1 = WriterTestHelper<unsigned_char,_4U,_32856U>::texinfo::compare
                              ((texinfo *)(in_RDI + 0x100),local_28);
        local_1c2 = 1;
        testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                  (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                   &in_stack_fffffffffffffd30->success_);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1c0);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffd60);
          in_stack_fffffffffffffd48 =
               testing::AssertionResult::failure_message((AssertionResult *)0x14ad8a);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffd60,type,in_stack_fffffffffffffd50,
                     (int)((ulong)in_stack_fffffffffffffd48 >> 0x20),in_stack_fffffffffffffd40);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffdb0,(Message *)in_stack_fffffffffffffda8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd30);
          testing::Message::~Message((Message *)0x14ade7);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x14ae58);
        local_38 = local_28 + 1;
        if ((local_9 & 1) != 0) {
          local_1ec = memcmp(local_38,*(void **)(in_RDI + 0x30),(ulong)*(uint *)(in_RDI + 0x38));
          local_1f0 = 0;
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
                     (int *)in_stack_fffffffffffffd38,(int *)in_stack_fffffffffffffd30);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1e8);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffd60);
            in_stack_fffffffffffffd40 =
                 testing::AssertionResult::failure_message((AssertionResult *)0x14af18);
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_fffffffffffffd60,type,in_stack_fffffffffffffd50,
                       (int)((ulong)in_stack_fffffffffffffd48 >> 0x20),in_stack_fffffffffffffd40);
            testing::internal::AssertHelper::operator=
                      (in_stack_fffffffffffffdb0,(Message *)in_stack_fffffffffffffda8);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffd30);
            testing::Message::~Message((Message *)0x14af75);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x14afe0);
          local_38 = (KTX_header *)(local_38->identifier + *(uint *)(in_RDI + 0x38));
        }
        local_218 = (ulong)local_38 & 3;
        local_21c = 0;
        testing::internal::EqHelper::Compare<long,_int,_nullptr>
                  (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
                   (long *)in_stack_fffffffffffffd38,(int *)in_stack_fffffffffffffd30);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_210);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffd60);
          in_stack_fffffffffffffd38 =
               (bool *)testing::AssertionResult::failure_message((AssertionResult *)0x14b08f);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffd60,type,in_stack_fffffffffffffd50,
                     (int)((ulong)in_stack_fffffffffffffd48 >> 0x20),in_stack_fffffffffffffd40);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffdb0,(Message *)in_stack_fffffffffffffda8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd30);
          testing::Message::~Message((Message *)0x14b0ec);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x14b15a);
        WriterTestHelper<unsigned_char,_4U,_32856U>::compareRawImages
                  (&in_stack_fffffffffffffda8->super_WriterTestHelper<unsigned_char,_4U,_32856U>,
                   in_RDI);
        testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                  (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                   &in_stack_fffffffffffffd30->success_);
        line = (int)((ulong)in_stack_fffffffffffffd48 >> 0x20);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_240);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffd60);
          this_00 = (AssertHelper *)
                    testing::AssertionResult::failure_message((AssertionResult *)0x14b1f2);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffd60,type,in_stack_fffffffffffffd50,line,
                     in_stack_fffffffffffffd40);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffdb0,(Message *)in_stack_fffffffffffffda8);
          testing::internal::AssertHelper::~AssertHelper(this_00);
          testing::Message::~Message((Message *)0x14b24f);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x14b2bd);
        if (local_28 != (KTX_header *)0x0) {
          operator_delete(local_28,1);
        }
        ktxTexture1_Destroy(local_18);
      }
    }
  }
  return;
}

Assistant:

void runTest(bool writeMetadata) {
        ktxTexture1* texture = 0;
        KTX_error_code result;
        ktx_uint8_t* ktxMemFile;
        ktx_size_t ktxMemFileLen;
        ktx_uint8_t* filePtr;

        result = ktxTexture1_Create(&helper.createInfo,
                                   KTX_TEXTURE_CREATE_ALLOC_STORAGE,
                                   &texture);
        EXPECT_EQ(result, KTX_SUCCESS);
        ASSERT_TRUE(texture != NULL) << "ktxTexture1_Create failed: "
                                     << ktxErrorString(result);

        if (writeMetadata)
            ktxHashList_AddKVPair(&texture->kvDataHead, KTX_ORIENTATION_KEY,
                                  (unsigned int)strlen(helper.orientation) + 1,
                                  helper.orientation);

        result = helper.copyImagesToTexture(texture);
        ASSERT_TRUE(result == KTX_SUCCESS);

        EXPECT_EQ(helper.compareTexture1Images(texture->pData), true);
        result = ktxTexture1_WriteToMemory(texture, &ktxMemFile, &ktxMemFileLen);

        ASSERT_TRUE(result == KTX_SUCCESS) << "ktxTexture_WriteToMemory failed: "
                                           << ktxErrorString(result);
        EXPECT_EQ(memcmp(ktxMemFile, ktxId, sizeof(ktxId)), 0);
        EXPECT_EQ(helper.texinfo.compare((KTX_header*)ktxMemFile), true);

        // Check the metadata.
        filePtr = ktxMemFile + sizeof(KTX_header);
        if (writeMetadata) {
            EXPECT_EQ(memcmp(filePtr, helper.kvData, helper.kvDataLen), 0);
            filePtr += helper.kvDataLen;
        }
        // Check data pointer is properly aligned.
        EXPECT_EQ((intptr_t)filePtr & 0x3, 0);

        EXPECT_EQ(helper.compareRawImages(filePtr), true);

        delete ktxMemFile;
        ktxTexture1_Destroy(texture);
    }